

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  char cVar1;
  char cVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  uint uVar5;
  _xmlNode *in_RAX;
  _xmlNode *p_Var6;
  uint uVar7;
  long lVar8;
  _xmlNode *p_Var9;
  int iVar10;
  ulong uVar11;
  _xmlNode *p_Var12;
  bool bVar13;
  bool bVar14;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam("searching namespaces stack (exc c14n)");
    uVar7 = 0;
  }
  else {
    p_Var9 = (_xmlNode *)0x1f55e3;
    if (ns != (xmlNsPtr)0x0) {
      in_RAX = (_xmlNode *)ns->prefix;
      p_Var9 = (_xmlNode *)0x1f55e3;
      if (in_RAX != (_xmlNode *)0x0) {
        p_Var9 = in_RAX;
      }
    }
    p_Var12 = (_xmlNode *)0x1f55e3;
    if (ns != (xmlNsPtr)0x0) {
      in_RAX = (_xmlNode *)ns->href;
      p_Var12 = (_xmlNode *)0x1f55e3;
      if (in_RAX != (_xmlNode *)0x0) {
        p_Var12 = in_RAX;
      }
    }
    uVar7 = 0;
    if (*(char *)&p_Var9->_private == '\0') {
      uVar7 = (uint)(*(char *)&p_Var12->_private == '\0');
    }
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      uVar11 = (ulong)(uint)cur->nsCurEnd;
      do {
        iVar4 = (int)in_RAX;
        iVar10 = (int)uVar11;
        if (iVar10 < 1) break;
        pxVar3 = (xmlNodePtr)cur->nsTab[uVar11 - 1];
        if (pxVar3 == (xmlNodePtr)0x0) {
          p_Var6 = (_xmlNode *)0x0;
        }
        else {
          p_Var6 = pxVar3->children;
        }
        if (p_Var9 == p_Var6) {
          bVar13 = true;
        }
        else if (p_Var6 == (_xmlNode *)0x0) {
          bVar13 = *(char *)&p_Var9->_private == '\0';
        }
        else {
          lVar8 = 0;
          do {
            cVar1 = *(char *)((long)&p_Var9->_private + lVar8);
            cVar2 = *(char *)((long)&p_Var6->_private + lVar8);
            bVar13 = cVar1 == cVar2;
            if (cVar2 == '\0') break;
            lVar8 = lVar8 + 1;
          } while (cVar1 == cVar2);
        }
        if (bVar13) {
          if (pxVar3 == (xmlNodePtr)0x0) {
            p_Var6 = (_xmlNode *)0x0;
          }
          else {
            p_Var6 = (_xmlNode *)pxVar3->name;
          }
          if (p_Var12 != p_Var6) {
            if (p_Var6 == (_xmlNode *)0x0) {
              bVar14 = *(char *)&p_Var12->_private == '\0';
            }
            else {
              lVar8 = 0;
              do {
                cVar1 = *(char *)((long)&p_Var12->_private + lVar8);
                cVar2 = *(char *)((long)&p_Var6->_private + lVar8);
                bVar14 = cVar1 == cVar2;
                if (cVar2 == '\0') break;
                lVar8 = lVar8 + 1;
              } while (cVar1 == cVar2);
            }
            in_RAX = (_xmlNode *)0x0;
            if (!bVar14) goto LAB_00138fc7;
          }
          if (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) {
            in_RAX = (_xmlNode *)&DAT_00000001;
          }
          else {
            uVar5 = (*ctx->is_visible_callback)(ctx->user_data,pxVar3,cur->nodeTab[uVar11 - 1]);
            in_RAX = (_xmlNode *)(ulong)uVar5;
          }
        }
LAB_00138fc7:
        iVar4 = (int)in_RAX;
        uVar11 = uVar11 - 1;
      } while (!bVar13);
      if (0 < iVar10) {
        return iVar4;
      }
    }
  }
  return uVar7;
}

Assistant:

static int
xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlC14NCtxPtr ctx) {
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam("searching namespaces stack (exc c14n)");
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = 0;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		if(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL)) {
		    return(xmlC14NIsVisible(ctx, ns1, cur->nodeTab[i]));
		} else {
		    return(0);
		}
	    }
        }
    }
    return(has_empty_ns);
}